

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SRUP_Syndicated_Data.cpp
# Opt level: O2

bool __thiscall SRUP_MSG_SYNDICATED_DATA::Serialize(SRUP_MSG_SYNDICATED_DATA *this,bool preSign)

{
  uint16_t l;
  ushort uVar1;
  int iVar2;
  uint8_t uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint8_t *puVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  
  if ((this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_token == (uint8_t *)0x0) {
    return false;
  }
  puVar7 = (uint8_t *)operator_new__(1);
  puVar8 = (uint8_t *)operator_new__(1);
  if ((((this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_sequence_ID == (uint64_t *)0x0) ||
      ((this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_sender_ID == (uint64_t *)0x0)) ||
     (this->m_source_ID == (uint64_t *)0x0)) {
LAB_00110f0e:
    operator_delete__(puVar7);
    operator_delete__(puVar8);
    bVar4 = false;
  }
  else {
    if (preSign) {
      iVar5 = (uint)(this->super_SRUP_MSG_DATA).m_data_ID_len +
              (uint)(this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_token_len;
      iVar2 = 6;
    }
    else {
      iVar5 = (uint)(this->super_SRUP_MSG_DATA).m_data_ID_len +
              (uint)(this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_token_len +
              (uint)(this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_sig_len;
      iVar2 = 8;
    }
    uVar6 = iVar2 + (uint)(this->super_SRUP_MSG_DATA).m_data_len + iVar5 + 0x1a;
    (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serial_length = uVar6;
    puVar9 = (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serialized;
    if (puVar9 != (uint8_t *)0x0) {
      operator_delete__(puVar9);
      uVar6 = (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serial_length;
    }
    puVar9 = (uint8_t *)operator_new__((ulong)uVar6);
    (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serialized = puVar9;
    memset(puVar9,0,(ulong)uVar6);
    *puVar9 = *(this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_version;
    puVar9[1] = *(this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_msgtype;
    for (lVar10 = 0; (int)lVar10 != 8; lVar10 = lVar10 + 1) {
      uVar3 = SRUP_MSG::getByteVal
                        (*(this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_sequence_ID,(uint8_t)lVar10);
      (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serialized[lVar10 + 2] = uVar3;
    }
    for (lVar10 = 0; (int)lVar10 != 8; lVar10 = lVar10 + 1) {
      uVar3 = SRUP_MSG::getByteVal
                        (*(this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_sender_ID,(uint8_t)lVar10);
      (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serialized[lVar10 + 10] = uVar3;
    }
    SRUP_MSG::encodeLength(puVar8,puVar7,(this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_token_len);
    (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serialized[0x12] = *puVar7;
    (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serialized[0x13] = *puVar8;
    memcpy((this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serialized + 0x14,
           (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_token,
           (ulong)(this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_token_len);
    uVar12 = (ulong)(this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_token_len;
    uVar11 = uVar12 + 0x14;
    if (!preSign) {
      if (((this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_signature == (uint8_t *)0x0) ||
         (l = (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_sig_len, l == 0)) goto LAB_00110f0e;
      SRUP_MSG::encodeLength(puVar8,puVar7,l);
      (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serialized[uVar11] = *puVar7;
      (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serialized[uVar12 + 0x15] = *puVar8;
      memcpy((this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serialized + uVar12 + 0x16,
             (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_signature,
             (ulong)(this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_sig_len);
      uVar11 = (ulong)((uint)(this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_sig_len +
                      (int)(uVar12 + 0x16));
    }
    SRUP_MSG::encodeLength(puVar8,puVar7,(this->super_SRUP_MSG_DATA).m_data_ID_len);
    (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serialized[uVar11] = *puVar7;
    (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serialized[uVar11 + 1] = *puVar8;
    memcpy((this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serialized + uVar11 + 2,
           (this->super_SRUP_MSG_DATA).m_data_ID,(ulong)(this->super_SRUP_MSG_DATA).m_data_ID_len);
    uVar6 = (uint)(this->super_SRUP_MSG_DATA).m_data_ID_len + (int)uVar11;
    SRUP_MSG::encodeLength(puVar8,puVar7,(this->super_SRUP_MSG_DATA).m_data_len);
    (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serialized[(ulong)uVar6 + 2] = *puVar7;
    (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serialized[(ulong)uVar6 + 3] = *puVar8;
    memcpy((this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serialized + (ulong)uVar6 + 4,
           (this->super_SRUP_MSG_DATA).m_data,(ulong)(this->super_SRUP_MSG_DATA).m_data_len);
    uVar1 = (this->super_SRUP_MSG_DATA).m_data_len;
    for (lVar10 = 0; (int)lVar10 != 8; lVar10 = lVar10 + 1) {
      uVar3 = SRUP_MSG::getByteVal(*this->m_source_ID,(uint8_t)lVar10);
      (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serialized[lVar10 + (ulong)(uVar1 + uVar6 + 4)] =
           uVar3;
    }
    operator_delete__(puVar7);
    operator_delete__(puVar8);
    if (preSign) {
      puVar7 = (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_unsigned_message;
      if (puVar7 != (uint8_t *)0x0) {
        operator_delete__(puVar7);
      }
      uVar6 = (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serial_length;
      puVar8 = (uint8_t *)operator_new__((ulong)uVar6);
      (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_unsigned_message = puVar8;
      puVar7 = (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serialized;
      memcpy(puVar8,puVar7,(ulong)uVar6);
      (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_unsigned_length = uVar6;
      (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serial_length = 0;
      if (puVar7 != (uint8_t *)0x0) {
        operator_delete__(puVar7);
      }
      (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_serialized = (uint8_t *)0x0;
    }
    (this->super_SRUP_MSG_DATA).super_SRUP_MSG.m_is_serialized = true;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool SRUP_MSG_SYNDICATED_DATA::Serialize(bool preSign)
{
    // As we're using dynamic memory - and only storing / sending the length of the data we have
    // we need to know how long all of the fields are so that we can unmarshall the data at
    // the other end...

    const uint16_t header_size = 18; // Two-bytes for the main header - plus 8 for the sequence ID ...
                                     // 8 for the sender ID
    const uint8_t field_length_size = 2;

    // We need the number of variable length fields - including the m_sig_len...
    // ... this can't be const as we need to change it depending on whether or not we're in pre-sign.
    // (If we are we need to reduce it by one for the unused m_sig_len)
    // We have the signature, the token, the data_ID & the data...
    uint8_t var_length_field_count = 4;

    const uint8_t len_source = 8; // 8 bytes for the 64-bit source ID.

    uint32_t serial_len;
    uint32_t p=0;

    uint8_t * msb;
    uint8_t * lsb;

    if (m_token == nullptr)
        return false;

    msb=new uint8_t[1];
    lsb=new uint8_t[1];

    // Now check that we have a sequence ID...
    if (m_sequence_ID == nullptr)
    {
        delete[] msb;
        delete[] lsb;
        return false;
    }

    // ...and check that we have a sender ID
    if (m_sender_ID == nullptr)
    {
        delete[] msb;
        delete[] lsb;
        return false;
    }

    // ...and check that we have a source ID
    if (m_source_ID == nullptr)
    {
        delete[] msb;
        delete[] lsb;
        return false;
    }

    // If we're calling this as a prelude to signing / verifying then we need to exclude the signature data from the
    // serial data we generate...

    if (preSign)
    {
        serial_len = m_token_len + m_data_ID_len + m_data_len + len_source;
        var_length_field_count--;
    }
    else
        serial_len = m_sig_len + m_token_len + m_data_ID_len + m_data_len + len_source;

    m_serial_length = serial_len + header_size + (field_length_size * var_length_field_count);

    delete[] m_serialized;

    m_serialized = new uint8_t[m_serial_length];
    std::memset(m_serialized, 0, m_serial_length);

    // The first two fields are fixed length (1 byte each).
    std::memcpy(m_serialized, m_version, 1);
    p+=1;
    std::memcpy(m_serialized + p, m_msgtype, 1);
    p+=1;

    // Now we need to add the Sequence ID (uint64_t)
    // See SRUP_Init.cpp for details...
    for (int x=0;x<8;x++)
    {
        uint8_t byte;
        byte = getByteVal(*m_sequence_ID, x);
        std::memcpy(m_serialized + p, &byte, 1);
        p+=1;
    }

    // And we need to do the same thing for the Sender ID (uint64_t)
    for (int x=0;x<8;x++)
    {
        uint8_t byte;
        byte = getByteVal(*m_sender_ID, x);
        std::memcpy(m_serialized + p, &byte, 1);
        p+=1;
    }

    // All of the other fields need their length to be specified...

    encodeLength(lsb, msb, m_token_len);
    std::memcpy(m_serialized + p, msb, 1);
    p+=1;
    std::memcpy(m_serialized + p, lsb, 1);
    p+=1;
    std::memcpy(m_serialized + p, m_token, m_token_len);
    p+=m_token_len;

    // If we're executing Serialize as a part of generating the signature - we can't marshall the signature
    // as we haven't calculated it yet. So only do the signature if we're not in preSign

    if (!preSign)
    {
        if (m_signature == nullptr)
        {
            delete[] msb;
            delete[] lsb;
            return false;
        }
        else
        {
            if (m_sig_len == 0)
            {
                delete[] msb;
                delete[] lsb;
                return false;
            }
            else
            {
                encodeLength(lsb, msb, m_sig_len);
                std::memcpy(m_serialized + p, msb, 1);
                p += 1;
                std::memcpy(m_serialized + p, lsb, 1);
                p += 1;
                std::memcpy(m_serialized + p, m_signature, m_sig_len);
                p += m_sig_len;
            }
        }
    }

    encodeLength(lsb, msb, m_data_ID_len);
    std::memcpy(m_serialized + p, msb, 1);
    p+=1;
    std::memcpy(m_serialized + p, lsb, 1);
    p+=1;
    std::memcpy(m_serialized + p, m_data_ID, m_data_ID_len);
    p+=m_data_ID_len;

    encodeLength(lsb, msb, m_data_len);
    std::memcpy(m_serialized + p, msb, 1);
    p+=1;
    std::memcpy(m_serialized + p, lsb, 1);
    p+=1;
    std::memcpy(m_serialized + p, m_data, m_data_len);
    p+=m_data_len;

    // Lastly we need to do add the source ID (uint64_t) - using the same approach as for other uint64_t values…
    for (int x=0;x<8;x++)
    {
        uint8_t byte;
        byte = getByteVal(*m_source_ID, x);
        std::memcpy(m_serialized + p, &byte, 1);
        p+=1;
    }

    delete[] msb;
    delete[] lsb;

    // If we're in preSign we don't have a real value for m_serialized - so copy the data to m_unsigned_message
    // and discard (and reset) m_serialized & m_serial_length...
    if (preSign)
    {
        delete[] m_unsigned_message;
        m_unsigned_message = new unsigned char[m_serial_length];

        std::memcpy(m_unsigned_message, m_serialized, m_serial_length);
        m_unsigned_length = m_serial_length;

        m_serial_length = 0;
        delete[] m_serialized;
        m_serialized= nullptr;
    }

    m_is_serialized = true;
    return true;

}